

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O2

bool __thiscall
MC::MC_Driver::addColunm(MC_Driver *this,string *colunmName,int attributype,int constraint)

{
  int *piVar1;
  TableInfo *pTVar2;
  iterator iVar3;
  ostream *poVar4;
  char *pcVar5;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  int local_78;
  int local_74;
  undefined1 local_70 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_48;
  
  local_78 = constraint;
  local_74 = attributype;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->tableInfo->getID)._M_t,colunmName);
  pTVar2 = this->tableInfo;
  if ((_Rb_tree_header *)iVar3._M_node != &(pTVar2->getID)._M_t._M_impl.super__Rb_tree_header) {
    poVar4 = std::operator<<((ostream *)&std::cout,"duplicate colunm ");
    poVar4 = std::operator<<(poVar4,(string *)colunmName);
LAB_0011c098:
    std::endl<char,std::char_traits<char>>(poVar4);
    return false;
  }
  if (0x1f < pTVar2->attributeNum) {
    poVar4 = (ostream *)&std::cout;
    pcVar5 = "exceed maximum number of attribute\n";
    goto LAB_0011c1e8;
  }
  if (attributype < 0x1d4c1) {
    if ((attributype == 50000) || (attributype == 90000)) goto LAB_0011c0fb;
    pcVar5 = "attributetype of ";
  }
  else {
    if (0x1d5bf < (uint)attributype) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "length of char type can not be longer than 255");
      goto LAB_0011c098;
    }
LAB_0011c0fb:
    if ((uint)constraint < 4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pTVar2->attributeName,colunmName);
      std::vector<int,_std::allocator<int>_>::push_back(&this->tableInfo->type,&local_74);
      std::vector<int,_std::allocator<int>_>::push_back(&this->tableInfo->constraint,&local_78);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
                (&local_48,colunmName,&this->tableInfo->attributeNum);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,int>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  *)&this->tableInfo->getID,&local_48);
      if (local_78 == 3) {
        pTVar2 = this->tableInfo;
        pTVar2->primary_key_id = pTVar2->attributeNum;
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_70,&pTVar2->attributeNum,colunmName);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)&this->tableInfo->indexInfo,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_70);
        std::__cxx11::string::~string((string *)(local_70 + 8));
      }
      piVar1 = &this->tableInfo->attributeNum;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::~string((string *)&local_48);
      return true;
    }
    pcVar5 = "attribute constraint of ";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  poVar4 = std::operator<<(poVar4,(string *)colunmName);
  pcVar5 = " unrecognized\n";
LAB_0011c1e8:
  std::operator<<(poVar4,pcVar5);
  return false;
}

Assistant:

bool MC::MC_Driver::addColunm(std::string colunmName,int attributype,int constraint){
    //是否重名
    auto it = tableInfo->getID.find(colunmName);
    if(it!=tableInfo->getID.end()){
        std::cout<<"duplicate colunm "<<colunmName<<std::endl;
        return false;
    }
    //是否超过最大属性数目
    if(tableInfo->attributeNum >= 32){
        std::cout<<"exceed maximum number of attribute\n";
        return false;
    }
    
    //检查类型是否没有错误
    if(attributype == 50000 || attributype == 90000 || attributype > 120000){
        if(attributype - 120000 > 255){
            //长度太长
            std::cout<<"length of char type can not be longer than 255"<<std::endl;
            return false;
        }
        //检查属性限制是否错误
        //0代表没有限制 1代表not null 2代表unique 3代表primary key
        if(constraint == 0 || constraint == 1 || constraint == 2 || constraint == 3){
            //类型和限制都没有错误
            tableInfo->attributeName.push_back(colunmName);
            tableInfo->type.push_back(attributype);
            tableInfo->constraint.push_back(constraint);
            std::pair<std::string,int> p = std::make_pair(colunmName,tableInfo->attributeNum);
            tableInfo->getID.insert(p);
            //如果是primary key需要加上它建立在的列的id
            if(constraint == 3){
                tableInfo->primary_key_id =  tableInfo->attributeNum;
                std::pair<int,std::string> p = std::make_pair(tableInfo->attributeNum, colunmName);
                tableInfo->indexInfo.insert(p);
            }
            tableInfo->attributeNum++;
            return true;
        }
        else{
            std::cout << "attribute constraint of " <<colunmName<<" unrecognized\n";
            return false;
        }
        //tableInfo->type_and_constraint.
    }else{
        //输入类型错误
        std::cout << "attributetype of " <<colunmName<<" unrecognized\n";
        return false;
    }
}